

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CNode::CopyStats(CNode *this,CNodeStats *stats)

{
  bool bVar1;
  Network NVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock34;
  CService addrLocalUnlocked;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  stats->nodeid = this->id;
  CAddress::operator=(&stats->addr,&this->addr);
  CAddress::operator=(&stats->addrBind,&this->addrBind);
  NVar2 = ConnectedThroughNetwork(this);
  stats->m_network = NVar2;
  (stats->m_last_send).__r = (this->m_last_send)._M_i.__r;
  (stats->m_last_recv).__r = (this->m_last_recv)._M_i.__r;
  (stats->m_last_tx_time).__r = (this->m_last_tx_time)._M_i.__r;
  (stats->m_last_block_time).__r = (this->m_last_block_time)._M_i.__r;
  (stats->m_connected).__r = (this->m_connected).__r;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&stats->m_addr_name,&this->m_addr_name);
  stats->nVersion = (this->nVersion).super___atomic_base<int>._M_i;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&addrLocalUnlocked,&this->m_subver_mutex,
             "m_subver_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x26a,false);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&stats->cleanSubVer,&this->cleanSubVer);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addrLocalUnlocked);
  stats->fInbound = this->m_conn_type == INBOUND;
  stats->m_bip152_highbandwidth_to = (bool)((this->m_bip152_highbandwidth_to)._M_base._M_i & 1);
  stats->m_bip152_highbandwidth_from = (bool)((this->m_bip152_highbandwidth_from)._M_base._M_i & 1);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&addrLocalUnlocked,&this->cs_vSend,
             "cs_vSend",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x271,false);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=(&(stats->mapSendBytesPerMsgType)._M_t,&(this->mapSendBytesPerMsgType)._M_t);
  stats->nSendBytes = this->nSendBytes;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addrLocalUnlocked);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock34,&this->cs_vRecv,"cs_vRecv",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x276,false);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=(&(stats->mapRecvBytesPerMsgType)._M_t,&(this->mapRecvBytesPerMsgType)._M_t);
  stats->nRecvBytes = this->nRecvBytes;
  (*((this->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t
     .super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
     super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[2])
            (&addrLocalUnlocked);
  stats->m_transport_type = addrLocalUnlocked.super_CNetAddr.m_addr._union.direct[0];
  if (addrLocalUnlocked.port._1_1_ == '\x01') {
    s.m_size = 0x20;
    s.m_data = (uchar *)((long)&addrLocalUnlocked.super_CNetAddr.m_addr._union + 1);
    HexStr_abi_cxx11_(&local_48,s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&stats->m_session_id,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock34.super_unique_lock);
  stats->m_permission_flags = this->m_permission_flags;
  (stats->m_last_ping_time).__r = (this->m_last_ping_time)._M_i.__r;
  (stats->m_min_ping_time).__r = (this->m_min_ping_time)._M_i.__r;
  GetAddrLocal(&addrLocalUnlocked,this);
  bVar1 = CNetAddr::IsValid(&addrLocalUnlocked.super_CNetAddr);
  if (bVar1) {
    CService::ToStringAddrPort_abi_cxx11_(&local_48,&addrLocalUnlocked);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"",(allocator<char> *)&criticalblock34);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&stats->addrLocal,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  stats->m_conn_type = this->m_conn_type;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrLocalUnlocked);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::CopyStats(CNodeStats& stats)
{
    stats.nodeid = this->GetId();
    X(addr);
    X(addrBind);
    stats.m_network = ConnectedThroughNetwork();
    X(m_last_send);
    X(m_last_recv);
    X(m_last_tx_time);
    X(m_last_block_time);
    X(m_connected);
    X(m_addr_name);
    X(nVersion);
    {
        LOCK(m_subver_mutex);
        X(cleanSubVer);
    }
    stats.fInbound = IsInboundConn();
    X(m_bip152_highbandwidth_to);
    X(m_bip152_highbandwidth_from);
    {
        LOCK(cs_vSend);
        X(mapSendBytesPerMsgType);
        X(nSendBytes);
    }
    {
        LOCK(cs_vRecv);
        X(mapRecvBytesPerMsgType);
        X(nRecvBytes);
        Transport::Info info = m_transport->GetInfo();
        stats.m_transport_type = info.transport_type;
        if (info.session_id) stats.m_session_id = HexStr(*info.session_id);
    }
    X(m_permission_flags);

    X(m_last_ping_time);
    X(m_min_ping_time);

    // Leave string empty if addrLocal invalid (not filled in yet)
    CService addrLocalUnlocked = GetAddrLocal();
    stats.addrLocal = addrLocalUnlocked.IsValid() ? addrLocalUnlocked.ToStringAddrPort() : "";

    X(m_conn_type);
}